

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall duckdb::ProducerToken::~ProducerToken(ProducerToken *this)

{
  ::std::unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>::
  ~unique_ptr(&(this->token).
               super_unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>
             );
  return;
}

Assistant:

ProducerToken::~ProducerToken() {
}